

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_unicode_sets.cpp
# Opt level: O0

Key icu_63::unisets::chooseFrom(UnicodeString *str,Key key1,Key key2)

{
  UBool UVar1;
  UnicodeSet *this;
  Key local_84;
  UnicodeString local_60;
  Key local_20;
  Key local_1c;
  Key key2_local;
  Key key1_local;
  UnicodeString *str_local;
  
  local_20 = key2;
  local_1c = key1;
  _key2_local = str;
  this = get(key1);
  UVar1 = UnicodeSet::contains(this,str);
  if (UVar1 == '\0') {
    UnicodeString::UnicodeString(&local_60,str);
    local_84 = chooseFrom(&local_60,local_20);
  }
  else {
    local_84 = local_1c;
  }
  str_local._4_4_ = local_84;
  if (UVar1 == '\0') {
    UnicodeString::~UnicodeString(&local_60);
  }
  return str_local._4_4_;
}

Assistant:

Key unisets::chooseFrom(UnicodeString str, Key key1, Key key2) {
    return get(key1)->contains(str) ? key1 : chooseFrom(str, key2);
}